

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O2

void __thiscall MasterObjectHolder::deleteAll(MasterObjectHolder *this)

{
  _Elt_pointer pbVar1;
  FedObject *pFVar2;
  Federate *this_00;
  AppObject *pAVar3;
  long *plVar4;
  _Elt_pointer pbVar5;
  unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_> *fed;
  _Elt_pointer pbVar6;
  _Map_pointer ppbVar7;
  handle fedHandle;
  handle local_40;
  
  if (((((this->tripDetect).lineDetector.
         super___shared_ptr<const_std::atomic<bool>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_M_base).
       _M_i & 1U) == 0) {
    gmlc::libguarded::
    guarded<std::deque<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::allocator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_>_>,_std::mutex>
    ::lock((handle *)&local_40,&this->feds);
    pbVar6 = ((local_40.data)->
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Deque_impl_data._M_start._M_cur;
    pbVar5 = ((local_40.data)->
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Deque_impl_data._M_start._M_last;
    ppbVar7 = ((local_40.data)->
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Deque_impl_data._M_start._M_node;
    pbVar1 = ((local_40.data)->
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Deque_impl_data._M_finish._M_cur;
    while (pbVar6 != pbVar1) {
      pFVar2 = ((_Head_base<0UL,_helics::FedObject_*,_false> *)
               &(((__uniq_ptr_impl<helics::AppObject,_std::default_delete<helics::AppObject>_> *)
                 &(pbVar6->_M_dataplus)._M_p)->_M_t).
                super__Tuple_impl<0UL,_helics::AppObject_*,_std::default_delete<helics::AppObject>_>
                .super__Head_base<0UL,_helics::AppObject_*,_false>)->_M_head_impl;
      if ((pFVar2 != (FedObject *)0x0) &&
         (this_00 = (pFVar2->fedptr).
                    super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
         this_00 != (Federate *)0x0)) {
        pFVar2->valid = 0;
        helics::Federate::finalize(this_00);
      }
      pbVar6 = (_Elt_pointer)&pbVar6->_M_string_length;
      if (pbVar6 == pbVar5) {
        pbVar6 = ppbVar7[1];
        ppbVar7 = ppbVar7 + 1;
        pbVar5 = pbVar6 + 0x10;
      }
    }
    std::
    deque<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::allocator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_>_>
    ::clear((deque<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::allocator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_>_>
             *)local_40.data);
    std::unique_lock<std::mutex>::~unique_lock(&local_40.m_handle_lock);
    gmlc::libguarded::
    guarded<std::deque<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>,_std::mutex>
    ::lock((handle *)&local_40,&this->apps);
    pbVar6 = ((local_40.data)->
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Deque_impl_data._M_start._M_cur;
    pbVar5 = ((local_40.data)->
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Deque_impl_data._M_start._M_last;
    ppbVar7 = ((local_40.data)->
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Deque_impl_data._M_start._M_node;
    pbVar1 = ((local_40.data)->
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Deque_impl_data._M_finish._M_cur;
    while (pbVar6 != pbVar1) {
      pFVar2 = ((_Head_base<0UL,_helics::FedObject_*,_false> *)
               &(((__uniq_ptr_impl<helics::AppObject,_std::default_delete<helics::AppObject>_> *)
                 &(pbVar6->_M_dataplus)._M_p)->_M_t).
                super__Tuple_impl<0UL,_helics::AppObject_*,_std::default_delete<helics::AppObject>_>
                .super__Head_base<0UL,_helics::AppObject_*,_false>)->_M_head_impl;
      if ((pFVar2 != (FedObject *)0x0) &&
         (*(long *)&(pFVar2->messages).messages.
                    super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
          != 0)) {
        helicsAppFinalize(pFVar2,(HelicsError *)0x0);
        *(undefined4 *)
         ((long)&(((_Head_base<0UL,_helics::FedObject_*,_false> *)
                  &(((__uniq_ptr_impl<helics::AppObject,_std::default_delete<helics::AppObject>_> *)
                    &(pbVar6->_M_dataplus)._M_p)->_M_t).
                   super__Tuple_impl<0UL,_helics::AppObject_*,_std::default_delete<helics::AppObject>_>
                   .super__Head_base<0UL,_helics::AppObject_*,_false>)->_M_head_impl->messages).
                 messages + 0x14) = 0;
      }
      pbVar6 = (_Elt_pointer)&pbVar6->_M_string_length;
      if (pbVar6 == pbVar5) {
        pbVar6 = ppbVar7[1];
        ppbVar7 = ppbVar7 + 1;
        pbVar5 = pbVar6 + 0x10;
      }
    }
    std::
    deque<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>
    ::clear((deque<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>
             *)local_40.data);
    std::unique_lock<std::mutex>::~unique_lock(&local_40.m_handle_lock);
    gmlc::libguarded::
    guarded<std::deque<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>,_std::allocator<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_>_>,_std::mutex>
    ::lock((handle *)&local_40,&this->cores);
    pbVar6 = ((local_40.data)->
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Deque_impl_data._M_start._M_cur;
    pbVar5 = ((local_40.data)->
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Deque_impl_data._M_start._M_last;
    ppbVar7 = ((local_40.data)->
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Deque_impl_data._M_start._M_node;
    pbVar1 = ((local_40.data)->
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Deque_impl_data._M_finish._M_cur;
    while (pbVar6 != pbVar1) {
      pAVar3 = (((__uniq_ptr_impl<helics::AppObject,_std::default_delete<helics::AppObject>_> *)
                &(pbVar6->_M_dataplus)._M_p)->_M_t).
               super__Tuple_impl<0UL,_helics::AppObject_*,_std::default_delete<helics::AppObject>_>.
               super__Head_base<0UL,_helics::AppObject_*,_false>._M_head_impl;
      if ((pAVar3 != (AppObject *)0x0) &&
         (plVar4 = *(long **)&(pAVar3->type)._M_dataplus, plVar4 != (long *)0x0)) {
        *(undefined4 *)((long)&pAVar3[1].type._M_string_length + 4) = 0;
        (**(code **)(*plVar4 + 0x40))();
      }
      pbVar6 = (_Elt_pointer)&pbVar6->_M_string_length;
      if (pbVar6 == pbVar5) {
        pbVar6 = ppbVar7[1];
        ppbVar7 = ppbVar7 + 1;
        pbVar5 = pbVar6 + 0x10;
      }
    }
    std::
    deque<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>,_std::allocator<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_>_>
    ::clear((deque<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>,_std::allocator<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_>_>
             *)local_40.data);
    std::unique_lock<std::mutex>::~unique_lock(&local_40.m_handle_lock);
    gmlc::libguarded::
    guarded<std::deque<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>,_std::allocator<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>_>_>,_std::mutex>
    ::lock((handle *)&local_40,&this->brokers);
    pbVar6 = ((local_40.data)->
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Deque_impl_data._M_start._M_cur;
    pbVar5 = ((local_40.data)->
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Deque_impl_data._M_start._M_last;
    ppbVar7 = ((local_40.data)->
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Deque_impl_data._M_start._M_node;
    pbVar1 = ((local_40.data)->
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Deque_impl_data._M_finish._M_cur;
    while (pbVar6 != pbVar1) {
      pAVar3 = (((__uniq_ptr_impl<helics::AppObject,_std::default_delete<helics::AppObject>_> *)
                &(pbVar6->_M_dataplus)._M_p)->_M_t).
               super__Tuple_impl<0UL,_helics::AppObject_*,_std::default_delete<helics::AppObject>_>.
               super__Head_base<0UL,_helics::AppObject_*,_false>._M_head_impl;
      if ((pAVar3 != (AppObject *)0x0) &&
         (plVar4 = *(long **)&(pAVar3->type)._M_dataplus, plVar4 != (long *)0x0)) {
        *(undefined4 *)((long)&(pAVar3->type).field_2 + 4) = 0;
        (**(code **)(*plVar4 + 0x18))();
      }
      pbVar6 = (_Elt_pointer)&pbVar6->_M_string_length;
      if (pbVar6 == pbVar5) {
        pbVar6 = ppbVar7[1];
        ppbVar7 = ppbVar7 + 1;
        pbVar5 = pbVar6 + 0x10;
      }
    }
    std::
    deque<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>,_std::allocator<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>_>_>
    ::clear((deque<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>,_std::allocator<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>_>_>
             *)local_40.data);
    std::unique_lock<std::mutex>::~unique_lock(&local_40.m_handle_lock);
    gmlc::libguarded::
    guarded<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::mutex>
    ::lock(&local_40,&this->errorStrings);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(local_40.data);
    std::unique_lock<std::mutex>::~unique_lock(&local_40.m_handle_lock);
  }
  return;
}

Assistant:

void helicsQuerySetQueryString(HelicsQuery query, const char* queryString, HelicsError* err)
{
    auto* queryObj = getQueryObj(query, err);
    if (queryObj == nullptr) {
        return;
    }
    queryObj->query = AS_STRING(queryString);
}